

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v7::detail::
       parse_replacement_field<char,fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&>
                 (char *begin,char *end,
                 format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 *handler)

{
  ulong uVar1;
  int id;
  buffer<char> *pbVar2;
  size_t sVar3;
  undefined1 value [16];
  undefined1 value_00 [16];
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_00;
  size_t __n;
  error_handler *begin_00;
  char *__src;
  error_handler *this;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  *__return_storage_ptr__;
  buffer<char> *c;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> out_01;
  format_arg arg;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
  adapter;
  unkbyte10 in_stack_ffffffffffffff58;
  undefined6 in_stack_ffffffffffffff62;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  local_98;
  int local_88;
  id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_&,_char>
  local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  buffer<char> *local_50;
  unsigned_long_long local_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  
  begin_00 = (error_handler *)(begin + 1);
  if (begin_00 == (error_handler *)end) {
    error_handler::on_error((error_handler *)begin,"invalid format string");
  }
  if (*begin_00 == (error_handler)0x7b) {
    pbVar2 = (handler->context).out_.container;
    sVar3 = pbVar2->size_;
    uVar1 = sVar3 + 1;
    if (pbVar2->capacity_ < uVar1) {
      (**pbVar2->_vptr_buffer)(pbVar2,uVar1);
    }
    pbVar2->size_ = uVar1;
    *(error_handler *)(pbVar2->ptr_ + sVar3) = *begin_00;
    goto LAB_00114f59;
  }
  if (*begin_00 == (error_handler)0x7d) {
    id = (handler->parse_context).next_arg_id_;
    if (id < 0) {
      error_handler::on_error
                ((error_handler *)begin,"cannot switch from manual to automatic argument indexing");
    }
    (handler->parse_context).next_arg_id_ = id + 1;
    __return_storage_ptr__ = &local_98;
    basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::get((format_arg *)&__return_storage_ptr__->string,&(handler->context).args_,id);
    if (local_88 == 0) {
LAB_00115145:
      error_handler::on_error((error_handler *)&__return_storage_ptr__->string,"argument not found")
      ;
    }
    if (0xe < local_88 - 1U) {
LAB_00115169:
      assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O3/_deps/fmt-src/include/fmt/format.h"
                  ,0x6bf,"");
    }
    out_01.container = (handler->context).out_.container;
    switch(local_88) {
    case 2:
switchD_00114e77_caseD_2:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_int,_0>
                (out_01,local_98.uint_value);
      goto LAB_00114f59;
    case 3:
switchD_00114e77_caseD_3:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_long,_0>
                (out_01,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
      goto LAB_00114f59;
    case 4:
switchD_00114e77_caseD_4:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned_long_long,_0>
                (out_01,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
      goto LAB_00114f59;
    case 5:
switchD_00114e77_caseD_5:
      out.container._4_4_ = local_98.long_long_value._4_4_;
      out.container._0_4_ = local_98.int_value;
      value._10_6_ = in_stack_ffffffffffffff62;
      value._0_10_ = in_stack_ffffffffffffff58;
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,___int128,_0>
                ((detail *)out_01.container,out,(__int128)value);
      goto LAB_00114f59;
    case 6:
switchD_00114e77_caseD_6:
      out_00.container._4_4_ = local_98.long_long_value._4_4_;
      out_00.container._0_4_ = local_98.int_value;
      value_00._10_6_ = in_stack_ffffffffffffff62;
      value_00._0_10_ = in_stack_ffffffffffffff58;
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_unsigned___int128,_0>
                ((detail *)out_01.container,out_00,(unsigned___int128)value_00);
      goto LAB_00114f59;
    case 7:
switchD_00114e77_caseD_7:
      sVar3 = (out_01.container)->size_;
      uVar1 = ((ulong)local_98.bool_value ^ 5) + sVar3;
      if ((out_01.container)->capacity_ < uVar1) {
        (**(out_01.container)->_vptr_buffer)(out_01.container,uVar1);
      }
      __src = "false";
      if (local_98.bool_value != false) {
        __src = "true";
      }
      (out_01.container)->size_ = uVar1;
      memcpy((out_01.container)->ptr_ + sVar3,__src,(ulong)local_98.bool_value ^ 5);
      goto LAB_00114f59;
    case 8:
switchD_00114e77_caseD_8:
      sVar3 = (out_01.container)->size_;
      uVar1 = sVar3 + 1;
      if ((out_01.container)->capacity_ < uVar1) {
        (**(out_01.container)->_vptr_buffer)(out_01.container,uVar1);
      }
      (out_01.container)->size_ = uVar1;
      (out_01.container)->ptr_[sVar3] = local_98.bool_value;
      goto LAB_00114f59;
    case 9:
switchD_00114e77_caseD_9:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_float,_0>
                (out_01,local_98.float_value);
      goto LAB_00114f59;
    case 10:
switchD_00114e77_caseD_a:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_double,_0>
                (out_01,(double)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
      goto LAB_00114f59;
    case 0xb:
switchD_00114e77_caseD_b:
      write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_double,_0>
                (out_01,(longdouble)
                        CONCAT28(local_98.int128_value._8_2_,
                                 CONCAT44(local_98.long_long_value._4_4_,local_98.int_value)));
      goto LAB_00114f59;
    case 0xc:
switchD_00114e77_caseD_c:
      write<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                (out_01,(char *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
      goto LAB_00114f59;
    case 0xd:
switchD_00114e77_caseD_d:
      __n = CONCAT62(local_98.int128_value._10_6_,local_98.int128_value._8_2_);
      sVar3 = (out_01.container)->size_;
      uVar1 = __n + sVar3;
      if ((out_01.container)->capacity_ < uVar1) {
        (**(out_01.container)->_vptr_buffer)(out_01.container,uVar1);
      }
      (out_01.container)->size_ = uVar1;
      if (__n != 0) {
        memmove((out_01.container)->ptr_ + sVar3,
                (void *)CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),__n);
      }
      goto LAB_00114f59;
    case 0xe:
switchD_00114e77_caseD_e:
      write_ptr<char,std::back_insert_iterator<fmt::v7::detail::buffer<char>>,unsigned_long>
                (out_01,CONCAT44(local_98.long_long_value._4_4_,local_98.int_value),
                 (basic_format_specs<char> *)0x0);
      goto LAB_00114f59;
    case 0xf:
switchD_00114e77_caseD_f:
      local_48 = (handler->context).args_.desc_;
      local_68 = 0;
      uStack_60 = 0;
      local_58 = 0;
      local_40 = *(undefined4 *)&(handler->context).args_.field_1;
      uStack_3c = *(undefined4 *)((long)&(handler->context).args_.field_1 + 4);
      uStack_38 = *(undefined4 *)&(handler->context).loc_.locale_;
      uStack_34 = *(undefined4 *)((long)&(handler->context).loc_.locale_ + 4);
      local_50 = out_01.container;
      (*(code *)CONCAT62(local_98.int128_value._10_6_,local_98.int128_value._8_2_))
                (CONCAT44(local_98.long_long_value._4_4_,local_98.int_value));
      goto LAB_00114f59;
    }
  }
  else {
    local_78.arg_id = 0;
    this = begin_00;
    local_78.handler = handler;
    begin_00 = (error_handler *)
               parse_arg_id<char,fmt::v7::detail::id_adapter<fmt::v7::detail::format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>,char,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>&,char>&>
                         ((char *)begin_00,end,&local_78);
    if (begin_00 == (error_handler *)end) {
LAB_00115139:
      error_handler::on_error(this,"missing \'}\' in format string");
    }
    if (*begin_00 == (error_handler)0x3a) {
      begin_00 = (error_handler *)
                 format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                 ::on_format_specs(handler,local_78.arg_id,(char *)(begin_00 + 1),end);
      if ((begin_00 == (error_handler *)end) || (*begin_00 != (error_handler)0x7d)) {
        error_handler::on_error((error_handler *)handler,"unknown format specifier");
      }
      goto LAB_00114f59;
    }
    if (*begin_00 != (error_handler)0x7d) goto LAB_00115139;
    __return_storage_ptr__ = &local_98;
    basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::get((format_arg *)&__return_storage_ptr__->string,&(handler->context).args_,local_78.arg_id);
    if (local_88 == 0) goto LAB_00115145;
    if (0xe < local_88 - 1U) goto LAB_00115169;
    out_01.container = (handler->context).out_.container;
    switch(local_88) {
    case 2:
      goto switchD_00114e77_caseD_2;
    case 3:
      goto switchD_00114e77_caseD_3;
    case 4:
      goto switchD_00114e77_caseD_4;
    case 5:
      goto switchD_00114e77_caseD_5;
    case 6:
      goto switchD_00114e77_caseD_6;
    case 7:
      goto switchD_00114e77_caseD_7;
    case 8:
      goto switchD_00114e77_caseD_8;
    case 9:
      goto switchD_00114e77_caseD_9;
    case 10:
      goto switchD_00114e77_caseD_a;
    case 0xb:
      goto switchD_00114e77_caseD_b;
    case 0xc:
      goto switchD_00114e77_caseD_c;
    case 0xd:
      goto switchD_00114e77_caseD_d;
    case 0xe:
      goto switchD_00114e77_caseD_e;
    case 0xf:
      goto switchD_00114e77_caseD_f;
    }
  }
  write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_int,_0>
            (out_01,local_98.int_value);
LAB_00114f59:
  return (char *)(begin_00 + 1);
}

Assistant:

FMT_CONSTEXPR const Char* parse_replacement_field(const Char* begin,
                                                  const Char* end,
                                                  Handler&& handler) {
  ++begin;
  if (begin == end) return handler.on_error("invalid format string"), end;
  if (static_cast<char>(*begin) == '}') {
    handler.on_replacement_field(handler.on_arg_id(), begin);
  } else if (*begin == '{') {
    handler.on_text(begin, begin + 1);
  } else {
    auto adapter = id_adapter<Handler, Char>{handler, 0};
    begin = parse_arg_id(begin, end, adapter);
    Char c = begin != end ? *begin : Char();
    if (c == '}') {
      handler.on_replacement_field(adapter.arg_id, begin);
    } else if (c == ':') {
      begin = handler.on_format_specs(adapter.arg_id, begin + 1, end);
      if (begin == end || *begin != '}')
        return handler.on_error("unknown format specifier"), end;
    } else {
      return handler.on_error("missing '}' in format string"), end;
    }
  }
  return begin + 1;
}